

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall JetHead::Socket::connect(Socket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  sockaddr *__addr_00;
  undefined4 in_register_00000034;
  int res;
  sockaddr *saddr;
  Address *pAStack_18;
  int len;
  Address *addr_local;
  Socket *this_local;
  
  pAStack_18 = (Address *)CONCAT44(in_register_00000034,__fd);
  addr_local = (Address *)this;
  __addr_00 = Address::getAddr(pAStack_18,(int *)((long)&saddr + 4));
  iVar1 = ::connect(this->mFd,(sockaddr *)__addr_00,saddr._4_4_);
  if (iVar1 == 0) {
    setConnected(this,true,1);
  }
  return iVar1;
}

Assistant:

int Socket::connect( const Socket::Address &addr )
{
	TRACE_BEGIN( LOG_LVL_INFO );
	int len;
	const struct sockaddr *saddr = addr.getAddr( len );
	int res = ::connect( mFd, saddr, len );

	LOG( "connect to %s on port %d", addr.getName(), addr.getPort() );

	if ( res == 0 )
		setConnected( true );

	return res;
}